

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)

{
  CTcPrsNode *pCVar1;
  CTcPrsSymtab *pCVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  CTPNArglist *arglist;
  undefined4 extraout_var;
  textchar_t *ptVar8;
  undefined4 extraout_var_01;
  CTcSymbol *pCVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  CTPNCall *this;
  char *in_RSI;
  CTPNArg *pCVar10;
  undefined4 extraout_var_00;
  
  arglist = parse_arg_list();
  if (arglist == (CTPNArglist *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  if (lhs == (CTcPrsNode *)0x0) {
LAB_0022e709:
    this = (CTPNCall *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)in_RSI);
    CTPNCall::CTPNCall(this,lhs,arglist);
  }
  else {
    iVar5 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(lhs,"defined",7);
    if (iVar5 == 0) {
LAB_0022e5c5:
      in_RSI = "__objref";
      iVar5 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(lhs,"__objref",8);
      if (iVar5 == 0) goto LAB_0022e709;
      iVar5 = (arglist->super_CTPNArglistBase).argc_;
      if (2 < iVar5) {
LAB_0022e5e9:
        CTcTokenizer::log_error(0x2be2);
        return lhs;
      }
      pCVar10 = (arglist->super_CTPNArglistBase).list_;
      if (iVar5 == 2) {
        pCVar1 = (pCVar10->super_CTPNArgBase).arg_expr_;
        pCVar10 = (pCVar10->super_CTPNArgBase).next_arg_;
        in_RSI = "warn";
        iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(pCVar1,"warn",4);
        bVar3 = true;
        if (iVar6 == 0) {
          in_RSI = "error";
          iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(pCVar1,"error",5);
          if (iVar6 == 0) goto LAB_0022e5e9;
          goto LAB_0022e63c;
        }
      }
      else {
LAB_0022e63c:
        bVar3 = false;
      }
      pCVar1 = (pCVar10->super_CTPNArgBase).arg_expr_;
      iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar1);
      if (CONCAT44(extraout_var_02,iVar6) == 0) {
        CTcTokenizer::log_error(0x2be2);
        goto LAB_0022e709;
      }
      pCVar2 = G_prs->global_symtab_;
      iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar1);
      ptVar8 = (textchar_t *)CONCAT44(extraout_var_03,iVar6);
      iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar1);
      pCVar9 = CTcPrsSymtab::find(pCVar2,ptVar8,CONCAT44(extraout_var_04,iVar6));
      if ((pCVar9 != (CTcSymbol *)0x0) &&
         (*(int *)&(pCVar9->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
          == 2)) {
        return pCVar1;
      }
      if ((iVar5 == 2) && ((G_prs->field_0xec & 4) == 0)) {
        iVar5 = 0x2d00;
        if (pCVar9 == (CTcSymbol *)0x0) {
          iVar5 = 0x2b18;
        }
        uVar7 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar1);
        iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar1);
        ptVar8 = (textchar_t *)(ulong)uVar7;
        if (bVar3) {
          CTcTokenizer::log_warning(iVar5);
        }
        else {
          CTcTokenizer::log_error(iVar5,ptVar8,CONCAT44(extraout_var_05,iVar6));
        }
      }
      this = (CTPNCall *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)ptVar8);
      *(undefined4 *)&(this->super_CTPNCallBase).func_ = 1;
    }
    else {
      if ((arglist->super_CTPNArglistBase).argc_ != 1) {
LAB_0022e5b9:
        CTcTokenizer::log_error(0x2be1);
        goto LAB_0022e5c5;
      }
      pCVar1 = (((arglist->super_CTPNArglistBase).list_)->super_CTPNArgBase).arg_expr_;
      iVar5 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar1);
      if (CONCAT44(extraout_var,iVar5) == 0) goto LAB_0022e5b9;
      pCVar2 = G_prs->global_symtab_;
      iVar5 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar1);
      ptVar8 = (textchar_t *)CONCAT44(extraout_var_00,iVar5);
      iVar5 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar1);
      pCVar9 = CTcPrsSymtab::find(pCVar2,ptVar8,CONCAT44(extraout_var_01,iVar5));
      if ((pCVar9 == (CTcSymbol *)0x0) ||
         (*(int *)&(pCVar9->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
          == 0)) {
        uVar4 = 1;
      }
      else {
        uVar4 = 2;
      }
      this = (CTPNCall *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)ptVar8);
      *(undefined4 *)&(this->super_CTPNCallBase).func_ = uVar4;
    }
    *(undefined1 *)&this[1].super_CTPNCallBase.arglist_ = 1;
    (this->super_CTPNCallBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_003505b8;
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)
{
    /* parse the argument list */
    CTPNArglist *arglist = parse_arg_list();
    if (arglist == 0)
        return 0;

    /* check for the special "defined()" syntax */
    if (lhs != 0 && lhs->sym_text_matches("defined", 7))
    {
        /* make sure we have one argument that's a symbol */
        CTcPrsNode *arg;
        if (arglist->get_argc() == 1
            && (arg = arglist->get_arg_list_head()->get_arg_expr())
                ->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());

            /* 
             *   The result is a constant 'true' or 'nil' node, depending on
             *   whether the symbol is defined.  Note that this is a "compile
             *   time constant" expression, not a true constant - flag it as
             *   such so that we don't generate a warning if this value is
             *   used as the conditional expression of an if, while, or for.
             */
            CTcConstVal cval;
            cval.set_bool(sym != 0 && sym->get_type() != TC_SYM_UNKNOWN);
            cval.set_ctc(TRUE);
            return new CTPNConst(&cval);
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR_DEFINED_SYNTAX);
        }
    }

    /* check for the special "__objref" syntax */
    if (lhs != 0 && lhs->sym_text_matches("__objref", 8))
    {
        /* assume we won't generate an error or warning if it's undefined */
        int errhandling = 0;

        /* get the rightmost argument */
        CTPNArg *curarg = arglist->get_arg_list_head();

        /* if we have other than two arguments, it's an error */
        if (arglist->get_argc() > 2)
        {
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
            return lhs;
        }

        /* if we have two arguments, get the warning/error mode */
        if (arglist->get_argc() == 2)
        {
            /* get the argument, and skip to the next to the left */
            CTcPrsNode *arg = curarg->get_arg_expr();
            curarg = curarg->get_next_arg();

            /* it has to be "warn" or "error" */
            if (arg->sym_text_matches("warn", 4))
            {
                errhandling = 1;
            }
            else if (arg->sym_text_matches("error", 5))
            {
                errhandling = 2;
            }
            else
            {
                G_tok->log_error(TCERR___OBJREF_SYNTAX);
                return lhs;
            }
        }

        /* the first argument must be a symbol */
        CTcPrsNode *arg = curarg->get_arg_expr();
        if (arg->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());
            
            /* 
             *   The result is the object reference value if the symbol is
             *   defined as an object, or nil if it's undefined or something
             *   other than an object.
             */
            CTcConstVal cval;
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* it's an object - the result is the object symbol */
                return arg;
            }
            else
            {
                /* log a warning or error, if applicable */
                if (errhandling != 0 && !G_prs->get_syntax_only())
                {
                    /* note whether it's undefined or otherwise defined */
                    int errcode =
                        (sym == 0 ? TCERR_UNDEF_SYM : TCERR_SYM_NOT_OBJ);

                    /* log an error or warning, as desired */
                    if (errhandling == 1)
                        G_tok->log_warning(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                    else
                        G_tok->log_error(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                }
                
                /* not defined or non-object - the result is nil */
                cval.set_bool(FALSE);
                cval.set_ctc(TRUE);
                return new CTPNConst(&cval);
            }
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
        }
    }

    /* build and return the function call node */
    return new CTPNCall(lhs, arglist);
}